

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

void __thiscall deqp::gls::AttributePack::~AttributePack(AttributePack *this)

{
  AttributePack *this_local;
  
  clearArrays(this);
  if (this->m_programID != 0) {
    (*this->m_ctx->_vptr_Context[0x77])(this->m_ctx,(ulong)this->m_programID);
  }
  if ((this->m_program != (ShaderProgram *)0x0) && (this->m_program != (ShaderProgram *)0x0)) {
    (*(this->m_program->super_VertexShader)._vptr_VertexShader[2])();
  }
  if ((this->m_useVao & 1U) != 0) {
    (*this->m_ctx->_vptr_Context[0x4d])(this->m_ctx,1,&this->m_vaoID);
  }
  tcu::Surface::~Surface(&this->m_screen);
  std::
  vector<deqp::gls::(anonymous_namespace)::AttributeArray_*,_std::allocator<deqp::gls::(anonymous_namespace)::AttributeArray_*>_>
  ::~vector(&this->m_arrays);
  return;
}

Assistant:

AttributePack::~AttributePack (void)
{
	clearArrays();

	if (m_programID)
		m_ctx.deleteProgram(m_programID);

	if (m_program)
		delete m_program;

	if (m_useVao)
		m_ctx.deleteVertexArrays(1, &m_vaoID);
}